

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int self_server_register_format(FMContext fmc,FMFormat_conflict fmformat)

{
  undefined8 uVar1;
  int iVar2;
  FMContext in_RSI;
  long in_RDI;
  server_ID_type *unaff_retaddr;
  format_rep server_format_rep;
  FMFormat_conflict in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    if (in_RSI[1].server_client_data == (void *)0x0) {
      build_server_format_rep((FMFormat_conflict)server_format_rep);
    }
    generate_format3_server_ID
              (unaff_retaddr,
               (_format_wire_format_1 *)
               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    iVar2 = get_format_server_verbose();
    if (iVar2 != 0) {
      uVar1._0_4_ = in_RSI->native_float_format;
      uVar1._4_4_ = in_RSI->native_column_major_arrays;
      printf("Registering %s to locally-issued format ID ",uVar1);
      print_format_ID((FMFormat_conflict)0x12b3c5);
      printf("\n");
    }
    iVar2 = 1;
  }
  else {
    iVar2 = self_server_register_format(in_RSI,in_stack_ffffffffffffffe0);
  }
  return iVar2;
}

Assistant:

static int
self_server_register_format(FMContext fmc, FMFormat fmformat)
{
    format_rep server_format_rep;
    /* we're a format server ourselves, assign an ID */
    if (fmc->master_context != NULL) {
	return self_server_register_format((FMContext) fmc->master_context,
					   fmformat);
    }
    if (fmformat->context != fmc) {
	/* registering in a master, copy it down */
	assert(0);
    }
    if (fmformat->server_format_rep == NULL) {
	server_format_rep = build_server_format_rep(fmformat);
    }
    server_format_rep = fmformat->server_format_rep;

    generate_format3_server_ID(&fmformat->server_ID, server_format_rep);
    if (get_format_server_verbose()) {
	printf("Registering %s to locally-issued format ID ",
	       fmformat->format_name);
	print_format_ID(fmformat);
	printf("\n");
    }
    return 1;
}